

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O3

void testExistingStreamsUTF8(string *tempDir)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  pointer pcVar5;
  long *plVar6;
  int iVar7;
  void *pvVar8;
  int *piVar9;
  ulong uVar10;
  int h;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  string outfn;
  RgbaOutputFile out;
  Header header;
  long *local_c8 [2];
  long local_b8 [2];
  void *local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  Rgba local_88 [3];
  Rgba local_70 [8];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing reading and writing using existing streams",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pvVar8 = operator_new__(0x37158);
  anon_unknown.dwarf_1579e2::fillPixels1((Array2D<Imf_3_4::Rgba> *)0x77,(int)pvVar8,h);
  local_c8[0] = local_b8;
  pcVar5 = (tempDir->_M_dataplus)._M_p;
  local_a0 = pvVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar5,pcVar5 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  remove((char *)local_c8[0]);
  local_88[0].r._h = 0;
  local_88[0].g._h = 0;
  local_88[0].b._h = 0;
  local_88[0].a._h = 0;
  Imf_3_4::Header::Header
            ((Header *)local_70,0x77,0xed,1.0,(Vec2 *)local_88,1.0,INCREASING_Y,NO_COMPRESSION);
  plVar6 = local_c8[0];
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_88,(char *)plVar6,(Header *)local_70,WRITE_RGBA,iVar7);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_88,(ulong)pvVar8,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_88);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_88);
  Imf_3_4::Header::~Header((Header *)local_70);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
  plVar6 = local_c8[0];
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_70,(char *)plVar6,iVar7);
  piVar9 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar7 = *piVar9;
  lVar11 = (long)piVar9[2] - (long)iVar7;
  uVar1 = lVar11 + 1;
  iVar4 = piVar9[3];
  lVar14 = (long)piVar9[1];
  local_90 = iVar4 - lVar14;
  uVar10 = (local_90 + 1) * uVar1;
  local_a8 = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
  local_98 = lVar14;
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_70,(long)local_a8 + (long)iVar7 * -8 + -lVar14 * uVar1 * 8,1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_70,piVar9[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
  pvVar8 = local_a0;
  if (-1 < (int)local_90) {
    lVar14 = (long)local_a0 + 6;
    lVar12 = (long)local_a8 + 6;
    uVar10 = 0;
    do {
      if (-1 < (int)lVar11) {
        uVar13 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar12 + -6 + uVar13 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar14 + -6 + uVar13 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x470,"void testExistingStreamsUTF8(const std::string &)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar12 + -4 + uVar13 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar14 + -4 + uVar13 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x471,"void testExistingStreamsUTF8(const std::string &)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar12 + -2 + uVar13 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar14 + -2 + uVar13 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x472,"void testExistingStreamsUTF8(const std::string &)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar12 + uVar13 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar14 + uVar13 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x473,"void testExistingStreamsUTF8(const std::string &)");
          }
          uVar13 = uVar13 + 1;
        } while ((uVar1 & 0xffffffff) != uVar13);
      }
      uVar10 = uVar10 + 1;
      lVar14 = lVar14 + 0x3b8;
      lVar12 = lVar12 + uVar1 * 8;
    } while (uVar10 != (iVar4 - (int)local_98) + 1);
  }
  operator_delete__(local_a8);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_70);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  remove((char *)local_c8[0]);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  operator_delete__(pvVar8);
  return;
}

Assistant:

void
testExistingStreamsUTF8 (const std::string& tempDir)
{

    cout << "Testing reading and writing using existing streams" << endl;

    const int W = 119;
    const int H = 237;
    Array2D<Rgba> p1 (H, W);

    fillPixels1 (p1, W, H);

    // per google translate, image in Japanese
    std::string   outfn = tempDir + "画像.exr";

    {
        cout << "writing";
#ifdef _WIN32
        _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
        remove (outfn.c_str ());
#endif
        Header      header (
            W,
            H,
            1,
            IMATH_NAMESPACE::V2f (0, 0),
            1,
            INCREASING_Y,
            NO_COMPRESSION);

        RgbaOutputFile out (
            outfn.c_str (),
            header,
            WRITE_RGBA);

        out.setFrameBuffer (&p1[0][0], 1, W);
        out.writePixels (H);
    }

    {
        cout << ", reading";
        RgbaInputFile in (outfn.c_str ());
        const Box2i& dw = in.dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        cout << ", comparing";
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (p2[y][x].r == p1[y][x].r);
                assert (p2[y][x].g == p1[y][x].g);
                assert (p2[y][x].b == p1[y][x].b);
                assert (p2[y][x].a == p1[y][x].a);
            }
        }
    }

    cout << endl;

#ifdef _WIN32
    _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
    remove (outfn.c_str ());
#endif
}